

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall
glslang::TResolverUniformAdaptor::operator()
          (TResolverUniformAdaptor *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          *entKey)

{
  TInfoSink *pTVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  TVarEntryInfo *this_00;
  char *pcVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppVar6;
  undefined1 local_d0 [8];
  TString errorMsg;
  _Self local_a0;
  iterator entKey2_1;
  undefined1 local_90 [4];
  uint32_t idx_1;
  TString err_1;
  _Self local_60;
  iterator entKey2;
  undefined1 local_50 [4];
  uint32_t idx;
  TString err;
  bool isValid;
  TVarEntryInfo *ent;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *entKey_local;
  TResolverUniformAdaptor *this_local;
  
  this_00 = &entKey->second;
  TVarEntryInfo::clearNewAssignments(this_00);
  uVar3 = (*this->resolver->_vptr_TIoMapResolver[2])(this->resolver,(ulong)this->stage,this_00);
  err.field_2._M_local_buf[0xf] = (byte)uVar3 & 1;
  if ((uVar3 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_d0,"Invalid binding: ",&entKey->first);
    pTVar1 = this->infoSink;
    pcVar5 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_d0);
    TInfoSinkBase::message(&pTVar1->info,EPrefixInternalError,pcVar5);
    *this->error = true;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_d0);
  }
  else {
    (*this->resolver->_vptr_TIoMapResolver[4])(this->resolver,(ulong)(entKey->second).stage,this_00)
    ;
    (*this->resolver->_vptr_TIoMapResolver[3])(this->resolver,(ulong)(entKey->second).stage,this_00)
    ;
    (*this->resolver->_vptr_TIoMapResolver[5])(this->resolver,(ulong)(entKey->second).stage,this_00)
    ;
    if ((entKey->second).newBinding != -1) {
      if (0xfffe < (entKey->second).newBinding) {
        std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )local_50,"mapped binding out of range: ",&entKey->first);
        pTVar1 = this->infoSink;
        pcVar5 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_50);
        TInfoSinkBase::message(&pTVar1->info,EPrefixInternalError,pcVar5);
        *this->error = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_50);
      }
      iVar4 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x21])();
      bVar2 = TQualifier::hasBinding((TQualifier *)CONCAT44(extraout_var,iVar4));
      if (bVar2) {
        for (entKey2._M_node._4_4_ = EShLangVertex; entKey2._M_node._4_4_ < EShLangCount;
            entKey2._M_node._4_4_ = entKey2._M_node._4_4_ + EShLangTessControl) {
          if ((entKey2._M_node._4_4_ != (entKey->second).stage) &&
             (this->uniformVarMap[entKey2._M_node._4_4_] != (TVarLiveMap *)0x0)) {
            local_60._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                 ::find(this->uniformVarMap[entKey2._M_node._4_4_],&entKey->first);
            err_1.field_2._8_8_ =
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                 ::end(this->uniformVarMap[entKey2._M_node._4_4_]);
            bVar2 = std::operator!=(&local_60,(_Self *)((long)&err_1.field_2 + 8));
            if (bVar2) {
              iVar4 = (entKey->second).newBinding;
              ppVar6 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                       ::operator->(&local_60);
              (ppVar6->second).newBinding = iVar4;
            }
          }
        }
      }
    }
    if ((entKey->second).newSet != -1) {
      if (0x3e < (entKey->second).newSet) {
        std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )local_90,"mapped set out of range: ",&entKey->first);
        pTVar1 = this->infoSink;
        pcVar5 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_90);
        TInfoSinkBase::message(&pTVar1->info,EPrefixInternalError,pcVar5);
        *this->error = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_90);
      }
      iVar4 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x21])();
      bVar2 = TQualifier::hasSet((TQualifier *)CONCAT44(extraout_var_00,iVar4));
      if (bVar2) {
        for (entKey2_1._M_node._4_4_ = EShLangVertex; entKey2_1._M_node._4_4_ < EShLangCount;
            entKey2_1._M_node._4_4_ = entKey2_1._M_node._4_4_ + EShLangTessControl) {
          if ((entKey2_1._M_node._4_4_ != this->stage) &&
             (this->uniformVarMap[entKey2_1._M_node._4_4_] != (TVarLiveMap *)0x0)) {
            local_a0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                 ::find(this->uniformVarMap[entKey2_1._M_node._4_4_],&entKey->first);
            errorMsg.field_2._8_8_ =
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                 ::end(this->uniformVarMap[entKey2_1._M_node._4_4_]);
            bVar2 = std::operator!=(&local_a0,(_Self *)((long)&errorMsg.field_2 + 8));
            if (bVar2) {
              iVar4 = (entKey->second).newSet;
              ppVar6 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                       ::operator->(&local_a0);
              (ppVar6->second).newSet = iVar4;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void operator()(std::pair<const TString, TVarEntryInfo>& entKey) {
        TVarEntryInfo& ent = entKey.second;
        ent.clearNewAssignments();
        const bool isValid = resolver.validateBinding(stage, ent);
        if (isValid) {
            resolver.resolveSet(ent.stage, ent);
            resolver.resolveBinding(ent.stage, ent);
            resolver.resolveUniformLocation(ent.stage, ent);

            if (ent.newBinding != -1) {
                if (ent.newBinding >= int(TQualifier::layoutBindingEnd)) {
                    TString err = "mapped binding out of range: " + entKey.first;

                    infoSink.info.message(EPrefixInternalError, err.c_str());
                    error = true;
                }

                if (ent.symbol->getQualifier().hasBinding()) {
                    for (uint32_t idx = EShLangVertex; idx < EShLangCount; ++idx) {
                        if (idx == ent.stage || uniformVarMap[idx] == nullptr)
                            continue;
                        auto entKey2 = uniformVarMap[idx]->find(entKey.first);
                        if (entKey2 != uniformVarMap[idx]->end()) {
                            entKey2->second.newBinding = ent.newBinding;
                        }
                    }
                }
            }
            if (ent.newSet != -1) {
                if (ent.newSet >= int(TQualifier::layoutSetEnd)) {
                    TString err = "mapped set out of range: " + entKey.first;

                    infoSink.info.message(EPrefixInternalError, err.c_str());
                    error = true;
                }
                if (ent.symbol->getQualifier().hasSet()) {
                    for (uint32_t idx = EShLangVertex; idx < EShLangCount; ++idx) {
                        if ((idx == stage) || (uniformVarMap[idx] == nullptr))
                            continue;
                        auto entKey2 = uniformVarMap[idx]->find(entKey.first);
                        if (entKey2 != uniformVarMap[idx]->end()) {
                            entKey2->second.newSet = ent.newSet;
                        }
                    }
                }
            }
        } else {
            TString errorMsg = "Invalid binding: " + entKey.first;
            infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
            error = true;
        }
    }